

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::RegisterTranscript(Model *this,Ptr *transcript)

{
  element_type *peVar1;
  SpeciesTracker *inst;
  shared_ptr<Polymer> local_28;
  Ptr *local_18;
  Ptr *transcript_local;
  Model *this_local;
  
  local_18 = transcript;
  transcript_local = (Ptr *)this;
  std::shared_ptr<Polymer>::shared_ptr<Transcript,void>(&local_28,transcript);
  RegisterPolymer(this,&local_28);
  std::shared_ptr<Polymer>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr_access<Transcript,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Transcript,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      transcript);
  inst = SpeciesTracker::Instance();
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::ConnectMember<SpeciesTracker>(&(peVar1->super_Polymer).termination_signal_,inst,0x142d50);
  if ((this->initialized_ & 1U) == 0) {
    std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>::
    push_back(&this->transcripts_,transcript);
  }
  return;
}

Assistant:

void Model::RegisterTranscript(Transcript::Ptr transcript) {
  RegisterPolymer(transcript);
  transcript->termination_signal_.ConnectMember(
      &SpeciesTracker::Instance(), &SpeciesTracker::TerminateTranslation);
  if (initialized_ == false) {
    transcripts_.push_back(transcript);
  }
}